

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_BlockSizeSmallerThanAllocation_Test::TestBody
          (ArenaTest_BlockSizeSmallerThanAllocation_Test *this)

{
  CachedBlock ***this_00;
  bool bVar1;
  long *plVar2;
  char *pcVar3;
  AssertHelper local_1c0;
  Message local_1b8;
  uint64_t local_1b0;
  int local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_3;
  Message local_188;
  int local_17c;
  uint64_t local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_2;
  Message local_158;
  uint64_t local_150;
  int local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_1;
  Message local_128;
  int local_11c;
  uint64_t local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar;
  undefined1 local_f0 [8];
  Arena arena;
  ArenaOptions opt;
  size_t i;
  ArenaTest_BlockSizeSmallerThanAllocation_Test *this_local;
  
  for (opt.block_dealloc = (_func_void_void_ptr_size_t *)0x0;
      opt.block_dealloc < (_func_void_void_ptr_size_t *)0x9;
      opt.block_dealloc = opt.block_dealloc + 1) {
    this_00 = &arena.impl_.first_arena_.cached_blocks_;
    ArenaOptions::ArenaOptions((ArenaOptions *)this_00);
    arena.impl_.first_arena_.cached_blocks_ = (CachedBlock **)opt.block_dealloc;
    Arena::Arena((Arena *)local_f0,(ArenaOptions *)this_00);
    plVar2 = Arena::Create<long>((Arena *)local_f0);
    *plVar2 = 0x2a;
    local_118 = Arena::SpaceAllocated((Arena *)local_f0);
    local_11c = 8;
    testing::internal::CmpHelperGE<unsigned_long,int>
              ((internal *)local_110,"arena.SpaceAllocated()","8",&local_118,&local_11c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
    if (!bVar1) {
      testing::Message::Message(&local_128);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x6d8,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_128);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
    local_144 = 8;
    local_150 = Arena::SpaceUsed((Arena *)local_f0);
    testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
              ((EqHelper *)local_140,"8","arena.SpaceUsed()",&local_144,&local_150);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
    if (!bVar1) {
      testing::Message::Message(&local_158);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x6d9,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_158);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_158);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
    plVar2 = Arena::Create<long>((Arena *)local_f0);
    *plVar2 = 0x2a;
    local_178 = Arena::SpaceAllocated((Arena *)local_f0);
    local_17c = 0x10;
    testing::internal::CmpHelperGE<unsigned_long,int>
              ((internal *)local_170,"arena.SpaceAllocated()","16",&local_178,&local_17c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
    if (!bVar1) {
      testing::Message::Message(&local_188);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x6dc,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_188);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_188);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
    local_1a4 = 0x10;
    local_1b0 = Arena::SpaceUsed((Arena *)local_f0);
    testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
              ((EqHelper *)local_1a0,"16","arena.SpaceUsed()",&local_1a4,&local_1b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
    if (!bVar1) {
      testing::Message::Message(&local_1b8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x6dd,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      testing::Message::~Message(&local_1b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
    Arena::~Arena((Arena *)local_f0);
  }
  return;
}

Assistant:

TEST(ArenaTest, BlockSizeSmallerThanAllocation) {
  for (size_t i = 0; i <= 8; ++i) {
    ArenaOptions opt;
    opt.start_block_size = opt.max_block_size = i;
    Arena arena(opt);

    *Arena::Create<int64_t>(&arena) = 42;
    EXPECT_GE(arena.SpaceAllocated(), 8);
    EXPECT_EQ(8, arena.SpaceUsed());

    *Arena::Create<int64_t>(&arena) = 42;
    EXPECT_GE(arena.SpaceAllocated(), 16);
    EXPECT_EQ(16, arena.SpaceUsed());
  }
}